

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O0

void pltcalc::doit(bool skipHeader,bool ordOutput,FILE **fout,
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *parquetFileNames)

{
  size_type sVar1;
  undefined1 local_90 [8];
  vector<period_occ,_std::allocator<period_occ>_> vp_legacy;
  undefined1 local_68 [8];
  vector<period_occ_granular,_std::allocator<period_occ_granular>_> vp_granular;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  FILE *local_40;
  FILE *outFile;
  _func_void_outrec_ptr_int_FILE_ptr *OutputDataLegacy;
  _func_void_outrec_granular_ptr_int_FILE_ptr *OutputDataGranular;
  int stream_type;
  int summarycalcstream_type;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *parquetFileNames_local;
  FILE **fout_local;
  bool ordOutput_local;
  bool skipHeader_local;
  
  _stream_type = parquetFileNames;
  parquetFileNames_local =
       (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)fout;
  fout_local._6_1_ = ordOutput;
  fout_local._7_1_ = skipHeader;
  loadoccurrence();
  if (((fout_local._6_1_ & 1) != 0) ||
     (sVar1 = std::
              map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size(_stream_type), sVar1 != 0)) {
    getperiodweights();
  }
  OutputDataGranular._4_4_ = 0;
  fread((void *)((long)&OutputDataGranular + 4),4,1,_stdin);
  OutputDataGranular._0_4_ = OutputDataGranular._4_4_ & 0x3000000;
  if ((uint)OutputDataGranular == 0x3000000) {
    OutputDataGranular._0_4_ = OutputDataGranular._4_4_ & 0xffffff;
    fread(&samplesize_,4,1,_stdin);
    if ((parquetFileNames_local->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)0x0) {
      getintervals();
    }
    OutputDataLegacy = (_func_void_outrec_ptr_int_FILE_ptr *)0x0;
    outFile = (FILE *)0x0;
    local_40 = (FILE *)0x0;
    if (((fout_local._6_1_ & 1) != 0) ||
       (sVar1 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size(_stream_type), sVar1 != 0)) {
      if (granular_date_ == 0) {
        outFile = (FILE *)outputrows_ord<pltcalc::outrec_const&>;
      }
      else {
        OutputDataLegacy = outputrows_ord<pltcalc::outrec_granular_const&>;
      }
    }
    if ((fout_local._6_1_ & 1) == 0) {
      sVar1 = std::
              map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size(_stream_type);
      if (sVar1 == 0) {
        if (date_algorithm_ == 0) {
          if ((fout_local._7_1_ & 1) == 0) {
            printf(
                  "type,summary_id,period_no,event_id,mean,standard_deviation,exposure_value,occ_date_id\n"
                  );
          }
          if (granular_date_ != 0) {
            fprintf(_stderr,"FATAL: Unknown date algorithm\n");
            exit(1);
          }
          outFile = (FILE *)outputrows<pltcalc::outrec_const&>;
        }
        else {
          if ((fout_local._7_1_ & 1) == 0) {
            printf(
                  "type,summary_id,period_no,event_id,mean,standard_deviation,exposure_value,occ_year,occ_month,occ_day\n"
                  );
          }
          if (granular_date_ == 0) {
            outFile = (FILE *)outputrows_da<pltcalc::outrec_const&>;
          }
          else {
            OutputDataLegacy = outputrows_da<pltcalc::outrec_granular_const&>;
          }
        }
        local_40 = _stdout;
      }
    }
    else {
      if ((fout_local._7_1_ & 1) == 0) {
        if (*(long *)&(parquetFileNames_local->_M_t)._M_impl != 0) {
          fprintf(*(FILE **)&(parquetFileNames_local->_M_t)._M_impl,
                  "Period,PeriodWeight,EventId,Year,Month,Day,Hour,Minute,SummaryId,SampleType,ChanceOfLoss,MeanLoss,SDLoss,MaxLoss,FootprintExposure,MeanImpactedExposure,MaxImpactedExposure\n"
                 );
        }
        if (*(long *)&(parquetFileNames_local->_M_t)._M_impl.super__Rb_tree_header._M_header != 0) {
          fprintf(*(FILE **)&(parquetFileNames_local->_M_t)._M_impl.super__Rb_tree_header._M_header,
                  "Period,PeriodWeight,EventId,Year,Month,Day,Hour,Minute,SummaryId,SampleId,Loss,ImpactedExposure\n"
                 );
        }
        if ((parquetFileNames_local->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent !=
            (_Base_ptr)0x0) {
          fprintf((FILE *)(parquetFileNames_local->_M_t)._M_impl.super__Rb_tree_header._M_header.
                          _M_parent,
                  "Period,PeriodWeight,EventId,Year,Month,Day,Hour,Minute,SummaryId,Quantile,Loss\n"
                 );
        }
      }
      local_40 = *(FILE **)&(parquetFileNames_local->_M_t)._M_impl;
    }
    if ((firstOutput & 1) == 1) {
      vp_granular.super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1000;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_48,
                 (int *)((long)&vp_granular.
                                super__Vector_base<period_occ_granular,_std::allocator<period_occ_granular>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_48);
      firstOutput = 0;
    }
    if ((uint)OutputDataGranular == 1) {
      if (granular_date_ == 0) {
        std::vector<period_occ,_std::allocator<period_occ>_>::vector
                  ((vector<period_occ,_std::allocator<period_occ>_> *)local_90);
        read_input<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,std::vector<period_occ,std::allocator<period_occ>>>
                  ((_func_void_outrec_ptr_int_FILE_ptr *)outFile,local_40,
                   (FILE **)parquetFileNames_local,
                   (map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
                    *)m_occ_legacy,(vector<period_occ,_std::allocator<period_occ>_> *)local_90);
        std::vector<period_occ,_std::allocator<period_occ>_>::~vector
                  ((vector<period_occ,_std::allocator<period_occ>_> *)local_90);
      }
      else {
        std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>::vector
                  ((vector<period_occ_granular,_std::allocator<period_occ_granular>_> *)local_68);
        read_input<pltcalc::outrec_granular,std::map<int,std::vector<period_occ_granular,std::allocator<period_occ_granular>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ_granular,std::allocator<period_occ_granular>>>>>,std::vector<period_occ_granular,std::allocator<period_occ_granular>>>
                  ((_func_void_outrec_granular_ptr_int_FILE_ptr *)OutputDataLegacy,local_40,
                   (FILE **)parquetFileNames_local,
                   (map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
                    *)m_occ_granular,
                   (vector<period_occ_granular,_std::allocator<period_occ_granular>_> *)local_68);
        std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>::~vector
                  ((vector<period_occ_granular,_std::allocator<period_occ_granular>_> *)local_68);
      }
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Not a summarycalc stream type\n");
  exit(-1);
}

Assistant:

void doit(bool skipHeader, bool ordOutput, FILE **fout,
		  std::map<int, std::string> &parquetFileNames)
	{
		loadoccurrence();
		if (ordOutput || parquetFileNames.size() != 0) getperiodweights();
		int summarycalcstream_type = 0;
		fread(&summarycalcstream_type, sizeof(summarycalcstream_type),
		      1, stdin);
		int stream_type = summarycalcstream_type & summarycalc_id;

		if (stream_type != summarycalc_id) {
			std::cerr << "Not a summarycalc stream type\n";
			exit(-1);
		}
		stream_type = streamno_mask & summarycalcstream_type;
		fread(&samplesize_, sizeof(samplesize_), 1, stdin);
#ifdef HAVE_PARQUET
		if (fout[QPLT] != nullptr || parquetFileNames.find(OasisParquet::QPLT) != parquetFileNames.end())
#else
		if (fout[QPLT] != nullptr)
#endif
		{
			getintervals();
		}

		void (*OutputDataGranular)(const outrec_granular&, const int,
					   FILE*) = nullptr;
		void (*OutputDataLegacy)(const outrec&, const int,
					 FILE*) = nullptr;
		FILE * outFile = nullptr;
		if (ordOutput || parquetFileNames.size() != 0) {
			if (granular_date_) {
				OutputDataGranular = outputrows_ord<const outrec_granular&>;
			} else {
				OutputDataLegacy = outputrows_ord<const outrec&>;
			}
		}

		if (ordOutput) {
			if (skipHeader == false) {
				if (fout[MPLT] != nullptr) {
					fprintf(fout[MPLT],
						"Period,PeriodWeight,EventId,"
						"Year,Month,Day,Hour,Minute,"
						"SummaryId,SampleType,"
						"ChanceOfLoss,MeanLoss,SDLoss,"
						"MaxLoss,FootprintExposure,"
						"MeanImpactedExposure,"
						"MaxImpactedExposure\n");
				}
				if (fout[SPLT] != nullptr) {
					fprintf(fout[SPLT],
						"Period,PeriodWeight,EventId,"
						"Year,Month,Day,Hour,Minute,"
						"SummaryId,SampleId,Loss,"
						"ImpactedExposure\n");
				}
				if (fout[QPLT] != nullptr) {
					fprintf(fout[QPLT],
						"Period,PeriodWeight,EventId,"
						"Year,Month,Day,Hour,Minute,"
						"SummaryId,Quantile,Loss\n");
				}
			}
			outFile = fout[MPLT];
		} else if (parquetFileNames.size() == 0) {
			if (date_algorithm_) {
				if (skipHeader == false) {
					printf("type,summary_id,period_no,event_id,mean,standard_deviation,exposure_value,occ_year,occ_month,occ_day\n");
				}
				if (granular_date_) {
					OutputDataGranular = outputrows_da<const outrec_granular&>;
				} else {
					OutputDataLegacy = outputrows_da<const outrec&>;
				}
			} else {
				if (skipHeader == false) {
					printf("type,summary_id,period_no,event_id,mean,standard_deviation,exposure_value,occ_date_id\n");
				}
				if (granular_date_) {   // Should not get here
					fprintf(stderr, "FATAL: Unknown date algorithm\n");
					exit(EXIT_FAILURE);
				} else {
					OutputDataLegacy = outputrows<const outrec&>;
				}
			}
			outFile = stdout;
		}

#ifdef HAVE_PARQUET
		for (auto iter = parquetFileNames.begin();
		  iter != parquetFileNames.end(); ++iter) {
			os_[iter->first] = OasisParquet::GetParquetStreamWriter(iter->first, iter->second);
		}
#endif

		if (firstOutput == true) {
			std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY)); // used to stop possible race condition with kat
			firstOutput = false;
		}
		if (stream_type == 1) {
			if (granular_date_) {
				std::vector<period_occ_granular> vp_granular;
				read_input(OutputDataGranular, outFile, fout,
					   m_occ_granular, vp_granular);
			} else {

				std::vector<period_occ> vp_legacy;
				read_input(OutputDataLegacy, outFile, fout,
					   m_occ_legacy, vp_legacy);
			}
		}
	}

}